

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_join_cluster_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  string local_40;
  
  if ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)&local_40,
               &(resp->peer_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
    if (peVar1 == (element_type *)local_40._M_dataplus._M_p) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (resp->accepted_ == true) {
        if ((peVar2 != (element_type *)0x0) && (iVar3 = (*peVar2->_vptr_logger[7])(), 3 < iVar3)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_40,"new server (%d) confirms it will join, start syncing logs to it",
                     (ulong)(uint)((((this->srv_to_join_).
                                     super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_join_cluster_resp",0xcb,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
        sync_log_to_new_srv(this,resp->next_idx_);
        return;
      }
      if (peVar2 == (element_type *)0x0) {
        return;
      }
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (iVar3 < 3) {
        return;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_40,"new server (%d) cannot accept the invitation, give up",
                 (ulong)(uint)((((this->srv_to_join_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_join_cluster_resp",0xcf,&local_40);
      goto LAB_0019aa84;
    }
  }
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    return;
  }
  iVar3 = (*peVar2->_vptr_logger[7])();
  if (iVar3 < 3) {
    return;
  }
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_(&local_40,"no server to join, drop the message");
  (*peVar2->_vptr_logger[8])
            (peVar2,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
             ,"handle_join_cluster_resp",0xd2,&local_40);
LAB_0019aa84:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void raft_server::handle_join_cluster_resp(resp_msg& resp) {
    if (srv_to_join_ && srv_to_join_ == resp.get_peer()) {
        if (resp.get_accepted()) {
            p_in("new server (%d) confirms it will join, "
                 "start syncing logs to it", srv_to_join_->get_id());
            sync_log_to_new_srv(resp.get_next_idx());
        } else {
            p_wn("new server (%d) cannot accept the invitation, give up",
                 srv_to_join_->get_id());
        }
    } else {
        p_wn("no server to join, drop the message");
    }
}